

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O3

void Wlc_NtkPrintNodeArray(Wlc_Ntk_t *p,Vec_Int_t *vArray)

{
  int iVar1;
  long lVar2;
  
  if (0 < vArray->nSize) {
    lVar2 = 0;
    do {
      iVar1 = vArray->pArray[lVar2];
      if (((long)iVar1 < 1) || (p->nObjsAlloc <= iVar1)) {
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      Wlc_NtkPrintNode(p,p->pObjs + iVar1);
      lVar2 = lVar2 + 1;
    } while (lVar2 < vArray->nSize);
  }
  return;
}

Assistant:

void Wlc_NtkPrintNodeArray( Wlc_Ntk_t * p, Vec_Int_t * vArray )
{
    Wlc_Obj_t * pObj; 
    int i;
    Wlc_NtkForEachObjVec( vArray, p, pObj, i )
        Wlc_NtkPrintNode( p, pObj );
}